

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void Col_RopeIterString(ColRopeIterator *it,Col_StringFormat format,void *data,size_t length)

{
  size_t length_local;
  void *data_local;
  Col_StringFormat format_local;
  ColRopeIterator *it_local;
  
  it->rope = 0;
  it->length = length;
  it->index = 0;
  (it->chunk).first = 0;
  (it->chunk).last = length - 1;
  (it->chunk).accessProc = (undefined1 *)0x0;
  (it->chunk).current.direct.format = format;
  (it->chunk).current.direct.address = data;
  return;
}

Assistant:

void
Col_RopeIterString(
    Col_RopeIterator it,        /*!< Iterator to initialize. */
    Col_StringFormat format,    /*!< Format of data in string (see
                                     #Col_StringFormat). */
    const void *data,           /*!< Buffer containing flat data. */
    size_t length)              /*!< Character length of string. */
{
    it->rope = WORD_NIL;
    it->length = length;
    it->index = 0;

    it->chunk.first = 0;
    it->chunk.last = length-1;
    it->chunk.accessProc = NULL;
    it->chunk.current.direct.format = format;
    it->chunk.current.direct.address = data;
}